

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_mp_check_error(void)

{
  int iVar1;
  char *local_3e8;
  char *p_39;
  char *end_39;
  char *data_39;
  char *p_38;
  char *end_38;
  char *data_38;
  char *p_37;
  char *end_37;
  char *data_37;
  char *p_36;
  char *end_36;
  char *data_36;
  char *p_35;
  char *end_35;
  char *data_35;
  char *p_34;
  char *end_34;
  char *data_34;
  char *p_33;
  char *end_33;
  char *data_33;
  char *p_32;
  char *end_32;
  char *data_32;
  char *p_31;
  char *end_31;
  char *data_31;
  char *p_30;
  char *end_30;
  char *data_30;
  char *p_29;
  char *end_29;
  char *data_29;
  char *p_28;
  char *end_28;
  char *data_28;
  char *p_27;
  char *end_27;
  char *data_27;
  char *p_26;
  char *end_26;
  char *data_26;
  char *p_25;
  char *end_25;
  char *data_25;
  char *p_24;
  char *end_24;
  char *data_24;
  char *p_23;
  char *end_23;
  char *data_23;
  char *p_22;
  char *end_22;
  char *data_22;
  char *p_21;
  char *end_21;
  char *data_21;
  char *p_20;
  char *end_20;
  char *data_20;
  char *p_19;
  char *end_19;
  char *data_19;
  char *p_18;
  char *end_18;
  char *data_18;
  char *p_17;
  char *end_17;
  char *data_17;
  char *p_16;
  char *end_16;
  char *data_16;
  char *p_15;
  char *end_15;
  char *data_15;
  char *p_14;
  char *end_14;
  char *data_14;
  char *p_13;
  char *end_13;
  char *data_13;
  char *p_12;
  char *end_12;
  char *data_12;
  char *p_11;
  char *end_11;
  char *data_11;
  char *p_10;
  char *end_10;
  char *data_10;
  char *p_9;
  char *end_9;
  char *data_9;
  char *p_8;
  char *end_8;
  char *data_8;
  char *p_7;
  char *end_7;
  char *data_7;
  char *p_6;
  char *end_6;
  char *data_6;
  char *p_5;
  char *end_5;
  char *data_5;
  char *p_4;
  char *end_4;
  char *data_4;
  char *p_3;
  char *end_3;
  char *data_3;
  char *p_2;
  char *end_2;
  char *data_2;
  char *p_1;
  char *end_1;
  char *data_1;
  char *p;
  char *end;
  char *data;
  mp_check_on_error_f mp_check_on_error_svp;
  mp_check_ext_data_f mp_check_ext_data_svp;
  int junk_error_count;
  int ext_error_count;
  int ill_error_count;
  int trunc_error_count;
  
  ext_error_count = 0x1e;
  junk_error_count = 3;
  mp_check_ext_data_svp._4_4_ = 4;
  mp_check_ext_data_svp._0_4_ = 3;
  _plan(0xee,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_mp_check_error");
  mp_check_on_error_svp = (mp_check_on_error_f)mp_check_ext_data;
  mp_check_ext_data = mp_check_ext_data_test;
  data = (char *)mp_check_on_error;
  mp_check_on_error = mp_check_on_error_test;
  end = anon_var_dwarf_10e0 + 0x12;
  p = anon_var_dwarf_10e0 + 0x12;
  data_1 = anon_var_dwarf_10e0 + 0x12;
  iVar1 = mp_check(&data_1,anon_var_dwarf_10e0 + 0x12);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6a8,
      "empty");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6a8,
      "empty - error type");
  _ok((uint)(last_error.data == end),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6a8,
      "empty - error data");
  _ok((uint)(last_error.end == p),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6a8,
      "empty - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6a8,
      "empty - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6a8,"empty - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6a8,"empty - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6a8,"empty - error ext len");
  }
  end_1 = anon_var_dwarf_7ac3;
  p_1 = anon_var_dwarf_7ac3 + 1;
  data_2 = anon_var_dwarf_7ac3;
  iVar1 = mp_check(&data_2,anon_var_dwarf_7ac3 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6aa,
      "trunc fixstr");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6aa,
      "trunc fixstr - error type");
  _ok((uint)(last_error.data == end_1),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6aa,
      "trunc fixstr - error data");
  _ok((uint)(last_error.end == p_1),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6aa,
      "trunc fixstr - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6aa,
      "trunc fixstr - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6aa,"trunc fixstr - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6aa,"trunc fixstr - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6aa,"trunc fixstr - error ext len");
  }
  end_2 = anon_var_dwarf_a80;
  p_2 = anon_var_dwarf_a80 + 1;
  data_3 = anon_var_dwarf_a80;
  iVar1 = mp_check(&data_3,anon_var_dwarf_a80 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ab,
      "trunc str8 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ab,
      "trunc str8 header - error type");
  _ok((uint)(last_error.data == end_2),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ab,
      "trunc str8 header - error data");
  _ok((uint)(last_error.end == p_2),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ab,
      "trunc str8 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ab,
      "trunc str8 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ab,"trunc str8 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ab,"trunc str8 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ab,"trunc str8 header - error ext len");
  }
  end_3 = anon_var_dwarf_7b8f;
  p_3 = anon_var_dwarf_7b8f + 2;
  data_4 = anon_var_dwarf_7b8f;
  iVar1 = mp_check(&data_4,anon_var_dwarf_7b8f + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ac,
      "trunc str8 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ac,
      "trunc str8 data - error type");
  _ok((uint)(last_error.data == end_3),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ac,
      "trunc str8 data - error data");
  _ok((uint)(last_error.end == p_3),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ac,
      "trunc str8 data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ac,
      "trunc str8 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ac,"trunc str8 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ac,"trunc str8 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ac,"trunc str8 data - error ext len");
  }
  end_4 = anon_var_dwarf_7bfb;
  p_4 = anon_var_dwarf_7bfb + 2;
  data_5 = anon_var_dwarf_7bfb;
  iVar1 = mp_check(&data_5,anon_var_dwarf_7bfb + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ad,
      "trunc str16 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ad,
      "trunc str16 header - error type");
  _ok((uint)(last_error.data == end_4),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ad,
      "trunc str16 header - error data");
  _ok((uint)(last_error.end == p_4),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ad,
      "trunc str16 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ad,
      "trunc str16 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ad,"trunc str16 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ad,"trunc str16 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ad,"trunc str16 header - error ext len");
  }
  end_5 = anon_var_dwarf_7c67;
  p_5 = anon_var_dwarf_7c67 + 3;
  data_6 = anon_var_dwarf_7c67;
  iVar1 = mp_check(&data_6,anon_var_dwarf_7c67 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ae,
      "trunc str16 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ae,
      "trunc str16 data - error type");
  _ok((uint)(last_error.data == end_5),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ae,
      "trunc str16 data - error data");
  _ok((uint)(last_error.end == p_5),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ae,
      "trunc str16 data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ae,
      "trunc str16 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ae,"trunc str16 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ae,"trunc str16 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ae,"trunc str16 data - error ext len");
  }
  end_6 = anon_var_dwarf_7cd3;
  p_6 = anon_var_dwarf_7cd3 + 4;
  data_7 = anon_var_dwarf_7cd3;
  iVar1 = mp_check(&data_7,anon_var_dwarf_7cd3 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6af,
      "trunc str32 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6af,
      "trunc str32 header - error type");
  _ok((uint)(last_error.data == end_6),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6af,
      "trunc str32 header - error data");
  _ok((uint)(last_error.end == p_6),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6af,
      "trunc str32 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6af,
      "trunc str32 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6af,"trunc str32 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6af,"trunc str32 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6af,"trunc str32 header - error ext len");
  }
  end_7 = anon_var_dwarf_7d3f;
  p_7 = anon_var_dwarf_7d3f + 5;
  data_8 = anon_var_dwarf_7d3f;
  iVar1 = mp_check(&data_8,anon_var_dwarf_7d3f + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b0,
      "trunc str32 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b0,
      "trunc str32 data - error type");
  _ok((uint)(last_error.data == end_7),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b0,
      "trunc str32 data - error data");
  _ok((uint)(last_error.end == p_7),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b0,
      "trunc str32 data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b0,
      "trunc str32 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b0,"trunc str32 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b0,"trunc str32 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b0,"trunc str32 data - error ext len");
  }
  end_8 = anon_var_dwarf_8657 + 3;
  p_8 = anon_var_dwarf_8657 + 4;
  data_9 = anon_var_dwarf_8657 + 3;
  iVar1 = mp_check(&data_9,anon_var_dwarf_8657 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b2,
      "trunc fixarray");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b2,
      "trunc fixarray - error type");
  _ok((uint)(last_error.data == end_8),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b2,
      "trunc fixarray - error data");
  _ok((uint)(last_error.end == p_8),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b2,
      "trunc fixarray - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 1),
      "last_error.pos - last_error.data == (ptrdiff_t)1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b2,
      "trunc fixarray - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 2),"last_error.trunc_count == 2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b2,"trunc fixarray - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b2,"trunc fixarray - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b2,"trunc fixarray - error ext len");
  }
  end_9 = anon_var_dwarf_7e23;
  p_9 = anon_var_dwarf_7e23 + 2;
  data_10 = anon_var_dwarf_7e23;
  iVar1 = mp_check(&data_10,anon_var_dwarf_7e23 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b3,
      "trunc array16 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b3,
      "trunc array16 header - error type");
  _ok((uint)(last_error.data == end_9),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b3,
      "trunc array16 header - error data");
  _ok((uint)(last_error.end == p_9),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b3,
      "trunc array16 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b3,
      "trunc array16 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b3,"trunc array16 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b3,"trunc array16 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b3,"trunc array16 header - error ext len");
  }
  end_10 = anon_var_dwarf_6a97;
  p_10 = anon_var_dwarf_6a97 + 3;
  data_11 = anon_var_dwarf_6a97;
  iVar1 = mp_check(&data_11,anon_var_dwarf_6a97 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b4,
      "trunc array16 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b4,
      "trunc array16 data - error type");
  _ok((uint)(last_error.data == end_10),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b4,
      "trunc array16 data - error data");
  _ok((uint)(last_error.end == p_10),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b4,
      "trunc array16 data - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 3),
      "last_error.pos - last_error.data == (ptrdiff_t)3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b4,
      "trunc array16 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0x10),"last_error.trunc_count == 16",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b4,"trunc array16 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b4,"trunc array16 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b4,"trunc array16 data - error ext len");
  }
  end_11 = anon_var_dwarf_7f07;
  p_11 = anon_var_dwarf_7f07 + 4;
  data_12 = anon_var_dwarf_7f07;
  iVar1 = mp_check(&data_12,anon_var_dwarf_7f07 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b5,
      "trunc array32 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b5,
      "trunc array32 header - error type");
  _ok((uint)(last_error.data == end_11),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b5,
      "trunc array32 header - error data");
  _ok((uint)(last_error.end == p_11),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b5,
      "trunc array32 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b5,
      "trunc array32 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b5,"trunc array32 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b5,"trunc array32 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b5,"trunc array32 header - error ext len");
  }
  end_12 = anon_var_dwarf_7f73;
  p_12 = anon_var_dwarf_7f73 + 5;
  data_13 = anon_var_dwarf_7f73;
  iVar1 = mp_check(&data_13,anon_var_dwarf_7f73 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b6,
      "trunc array32 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b6,
      "trunc array32 data - error type");
  _ok((uint)(last_error.data == end_12),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b6,
      "trunc array32 data - error data");
  _ok((uint)(last_error.end == p_12),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b6,
      "trunc array32 data - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 5),
      "last_error.pos - last_error.data == (ptrdiff_t)5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b6,
      "trunc array32 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0x10),"last_error.trunc_count == 16",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b6,"trunc array32 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b6,"trunc array32 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b6,"trunc array32 data - error ext len");
  }
  end_13 = anon_var_dwarf_86cf + 4;
  p_13 = anon_var_dwarf_86cf + 5;
  data_14 = anon_var_dwarf_86cf + 4;
  iVar1 = mp_check(&data_14,anon_var_dwarf_86cf + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b8,
      "trunc fixmap");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b8,
      "trunc fixmap - error type");
  _ok((uint)(last_error.data == end_13),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b8,
      "trunc fixmap - error data");
  _ok((uint)(last_error.end == p_13),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b8,
      "trunc fixmap - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 1),
      "last_error.pos - last_error.data == (ptrdiff_t)1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b8,
      "trunc fixmap - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 4),"last_error.trunc_count == 4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b8,"trunc fixmap - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b8,"trunc fixmap - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b8,"trunc fixmap - error ext len");
  }
  end_14 = anon_var_dwarf_8063;
  p_14 = anon_var_dwarf_8063 + 2;
  data_15 = anon_var_dwarf_8063;
  iVar1 = mp_check(&data_15,anon_var_dwarf_8063 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b9,
      "trunc map16 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b9,
      "trunc map16 header - error type");
  _ok((uint)(last_error.data == end_14),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b9,
      "trunc map16 header - error data");
  _ok((uint)(last_error.end == p_14),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b9,
      "trunc map16 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6b9,
      "trunc map16 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b9,"trunc map16 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b9,"trunc map16 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6b9,"trunc map16 header - error ext len");
  }
  end_15 = anon_var_dwarf_6fa7;
  p_15 = anon_var_dwarf_6fa7 + 3;
  data_16 = anon_var_dwarf_6fa7;
  iVar1 = mp_check(&data_16,anon_var_dwarf_6fa7 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ba,
      "trunc map16 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ba,
      "trunc map16 data - error type");
  _ok((uint)(last_error.data == end_15),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ba,
      "trunc map16 data - error data");
  _ok((uint)(last_error.end == p_15),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ba,
      "trunc map16 data - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 3),
      "last_error.pos - last_error.data == (ptrdiff_t)3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ba,
      "trunc map16 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0x20),"last_error.trunc_count == 32",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ba,"trunc map16 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ba,"trunc map16 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ba,"trunc map16 data - error ext len");
  }
  end_16 = anon_var_dwarf_813b;
  p_16 = anon_var_dwarf_813b + 4;
  data_17 = anon_var_dwarf_813b;
  iVar1 = mp_check(&data_17,anon_var_dwarf_813b + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bb,
      "trunc map32 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bb,
      "trunc map32 header - error type");
  _ok((uint)(last_error.data == end_16),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bb,
      "trunc map32 header - error data");
  _ok((uint)(last_error.end == p_16),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bb,
      "trunc map32 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bb,
      "trunc map32 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bb,"trunc map32 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bb,"trunc map32 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bb,"trunc map32 header - error ext len");
  }
  end_17 = anon_var_dwarf_81a7;
  p_17 = anon_var_dwarf_81a7 + 5;
  data_18 = anon_var_dwarf_81a7;
  iVar1 = mp_check(&data_18,anon_var_dwarf_81a7 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bc,
      "trunc map32 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bc,
      "trunc map32 data - error type");
  _ok((uint)(last_error.data == end_17),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bc,
      "trunc map32 data - error data");
  _ok((uint)(last_error.end == p_17),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bc,
      "trunc map32 data - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 5),
      "last_error.pos - last_error.data == (ptrdiff_t)5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bc,
      "trunc map32 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0x20),"last_error.trunc_count == 32",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bc,"trunc map32 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bc,"trunc map32 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bc,"trunc map32 data - error ext len");
  }
  end_18 = anon_var_dwarf_900;
  p_18 = anon_var_dwarf_900 + 1;
  data_19 = anon_var_dwarf_900;
  iVar1 = mp_check(&data_19,anon_var_dwarf_900 + 1);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6be,
      "trunc fixext header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6be,
      "trunc fixext header - error type");
  _ok((uint)(last_error.data == end_18),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6be,
      "trunc fixext header - error data");
  _ok((uint)(last_error.end == p_18),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6be,
      "trunc fixext header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6be,
      "trunc fixext header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6be,"trunc fixext header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6be,"trunc fixext header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6be,"trunc fixext header - error ext len");
  }
  end_19 = anon_var_dwarf_8273;
  p_19 = anon_var_dwarf_8273 + 2;
  data_20 = anon_var_dwarf_8273;
  iVar1 = mp_check(&data_20,anon_var_dwarf_8273 + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bf,
      "trunc fixext data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bf,
      "trunc fixext data - error type");
  _ok((uint)(last_error.data == end_19),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bf,
      "trunc fixext data - error data");
  _ok((uint)(last_error.end == p_19),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bf,
      "trunc fixext data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6bf,
      "trunc fixext data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bf,"trunc fixext data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bf,"trunc fixext data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6bf,"trunc fixext data - error ext len");
  }
  end_20 = anon_var_dwarf_82df;
  p_20 = anon_var_dwarf_82df + 2;
  data_21 = anon_var_dwarf_82df;
  iVar1 = mp_check(&data_21,anon_var_dwarf_82df + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c0,
      "trunc ext8 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c0,
      "trunc ext8 header - error type");
  _ok((uint)(last_error.data == end_20),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c0,
      "trunc ext8 header - error data");
  _ok((uint)(last_error.end == p_20),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c0,
      "trunc ext8 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c0,
      "trunc ext8 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c0,"trunc ext8 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c0,"trunc ext8 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c0,"trunc ext8 header - error ext len");
  }
  end_21 = anon_var_dwarf_834b;
  p_21 = anon_var_dwarf_834b + 3;
  data_22 = anon_var_dwarf_834b;
  iVar1 = mp_check(&data_22,anon_var_dwarf_834b + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c1,
      "trunc ext8 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c1,
      "trunc ext8 data - error type");
  _ok((uint)(last_error.data == end_21),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c1,
      "trunc ext8 data - error data");
  _ok((uint)(last_error.end == p_21),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c1,
      "trunc ext8 data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c1,
      "trunc ext8 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c1,"trunc ext8 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c1,"trunc ext8 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c1,"trunc ext8 data - error ext len");
  }
  end_22 = anon_var_dwarf_83b7;
  p_22 = anon_var_dwarf_83b7 + 3;
  data_23 = anon_var_dwarf_83b7;
  iVar1 = mp_check(&data_23,anon_var_dwarf_83b7 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c2,
      "trunc ext16 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c2,
      "trunc ext16 header - error type");
  _ok((uint)(last_error.data == end_22),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c2,
      "trunc ext16 header - error data");
  _ok((uint)(last_error.end == p_22),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c2,
      "trunc ext16 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c2,
      "trunc ext16 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c2,"trunc ext16 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c2,"trunc ext16 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c2,"trunc ext16 header - error ext len");
  }
  end_23 = anon_var_dwarf_8423;
  p_23 = anon_var_dwarf_8423 + 4;
  data_24 = anon_var_dwarf_8423;
  iVar1 = mp_check(&data_24,anon_var_dwarf_8423 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c3,
      "trunc ext16 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c3,
      "trunc ext16 data - error type");
  _ok((uint)(last_error.data == end_23),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c3,
      "trunc ext16 data - error data");
  _ok((uint)(last_error.end == p_23),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c3,
      "trunc ext16 data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c3,
      "trunc ext16 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c3,"trunc ext16 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c3,"trunc ext16 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c3,"trunc ext16 data - error ext len");
  }
  end_24 = anon_var_dwarf_848f;
  p_24 = anon_var_dwarf_848f + 5;
  data_25 = anon_var_dwarf_848f;
  iVar1 = mp_check(&data_25,anon_var_dwarf_848f + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c4,
      "trunc ext32 header");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c4,
      "trunc ext32 header - error type");
  _ok((uint)(last_error.data == end_24),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c4,
      "trunc ext32 header - error data");
  _ok((uint)(last_error.end == p_24),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c4,
      "trunc ext32 header - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c4,
      "trunc ext32 header - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c4,"trunc ext32 header - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c4,"trunc ext32 header - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c4,"trunc ext32 header - error ext len");
  }
  end_25 = anon_var_dwarf_84fb;
  p_25 = anon_var_dwarf_84fb + 6;
  data_26 = anon_var_dwarf_84fb;
  iVar1 = mp_check(&data_26,anon_var_dwarf_84fb + 6);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c5,
      "trunc ext32 data");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c5,
      "trunc ext32 data - error type");
  _ok((uint)(last_error.data == end_25),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c5,
      "trunc ext32 data - error data");
  _ok((uint)(last_error.end == p_25),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c5,
      "trunc ext32 data - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c5,
      "trunc ext32 data - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 1),"last_error.trunc_count == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c5,"trunc ext32 data - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c5,"trunc ext32 data - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c5,"trunc ext32 data - error ext len");
  }
  end_26 = anon_var_dwarf_86cf + 3;
  p_26 = anon_var_dwarf_86cf + 5;
  data_27 = anon_var_dwarf_86cf + 3;
  iVar1 = mp_check(&data_27,anon_var_dwarf_86cf + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c7,
      "trunc nested 1");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c7,
      "trunc nested 1 - error type");
  _ok((uint)(last_error.data == end_26),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c7,
      "trunc nested 1 - error data");
  _ok((uint)(last_error.end == p_26),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c7,
      "trunc nested 1 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 2),
      "last_error.pos - last_error.data == (ptrdiff_t)2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c7,
      "trunc nested 1 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 5),"last_error.trunc_count == 5",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c7,"trunc nested 1 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c7,"trunc nested 1 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c7,"trunc nested 1 - error ext len");
  }
  end_27 = anon_var_dwarf_85eb;
  p_27 = anon_var_dwarf_85eb + 3;
  data_28 = anon_var_dwarf_85eb;
  iVar1 = mp_check(&data_28,anon_var_dwarf_85eb + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c8,
      "trunc nested 2");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c8,
      "trunc nested 2 - error type");
  _ok((uint)(last_error.data == end_27),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c8,
      "trunc nested 2 - error data");
  _ok((uint)(last_error.end == p_27),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c8,
      "trunc nested 2 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 3),
      "last_error.pos - last_error.data == (ptrdiff_t)3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c8,
      "trunc nested 2 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 4),"last_error.trunc_count == 4",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c8,"trunc nested 2 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c8,"trunc nested 2 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c8,"trunc nested 2 - error ext len");
  }
  end_28 = anon_var_dwarf_8657;
  p_28 = anon_var_dwarf_8657 + 4;
  data_29 = anon_var_dwarf_8657;
  iVar1 = mp_check(&data_29,anon_var_dwarf_8657 + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c9,
      "trunc nested 3");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c9,
      "trunc nested 3 - error type");
  _ok((uint)(last_error.data == end_28),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c9,
      "trunc nested 3 - error data");
  _ok((uint)(last_error.end == p_28),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c9,
      "trunc nested 3 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 4),
      "last_error.pos - last_error.data == (ptrdiff_t)4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6c9,
      "trunc nested 3 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 5),"last_error.trunc_count == 5",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c9,"trunc nested 3 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c9,"trunc nested 3 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6c9,"trunc nested 3 - error ext len");
  }
  end_29 = anon_var_dwarf_86cf;
  p_29 = anon_var_dwarf_86cf + 5;
  data_30 = anon_var_dwarf_86cf;
  iVar1 = mp_check(&data_30,anon_var_dwarf_86cf + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ca,
      "trunc nested 4");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_TRUNC),"last_error.type == MP_CHECK_ERROR_TRUNC",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ca,
      "trunc nested 4 - error type");
  _ok((uint)(last_error.data == end_29),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ca,
      "trunc nested 4 - error data");
  _ok((uint)(last_error.end == p_29),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ca,
      "trunc nested 4 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 5),
      "last_error.pos - last_error.data == (ptrdiff_t)5",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ca,
      "trunc nested 4 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 8),"last_error.trunc_count == 8",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ca,"trunc nested 4 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ca,"trunc nested 4 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ca,"trunc nested 4 - error ext len");
  }
  end_30 = anon_var_dwarf_8ad7 + 2;
  p_30 = anon_var_dwarf_8ad7 + 3;
  data_31 = anon_var_dwarf_8ad7 + 2;
  iVar1 = mp_check(&data_31,anon_var_dwarf_8ad7 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cc,
      "ill 1");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_ILL),"last_error.type == MP_CHECK_ERROR_ILL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cc,
      "ill 1 - error type");
  _ok((uint)(last_error.data == end_30),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cc,
      "ill 1 - error data");
  _ok((uint)(last_error.end == p_30),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cc,
      "ill 1 - error data end");
  _ok((uint)(last_error.pos == last_error.data),"last_error.pos - last_error.data == (ptrdiff_t)0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cc,
      "ill 1 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6cc,"ill 1 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6cc,"ill 1 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6cc,"ill 1 - error ext len");
  }
  end_31 = anon_var_dwarf_87bf;
  p_31 = anon_var_dwarf_87bf + 2;
  data_32 = anon_var_dwarf_87bf;
  iVar1 = mp_check(&data_32,anon_var_dwarf_87bf + 2);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cd,
      "ill 2");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_ILL),"last_error.type == MP_CHECK_ERROR_ILL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cd,
      "ill 2 - error type");
  _ok((uint)(last_error.data == end_31),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cd,
      "ill 2 - error data");
  _ok((uint)(last_error.end == p_31),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cd,
      "ill 2 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 1),
      "last_error.pos - last_error.data == (ptrdiff_t)1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6cd,
      "ill 2 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6cd,"ill 2 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6cd,"ill 2 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6cd,"ill 2 - error ext len");
  }
  end_32 = anon_var_dwarf_7883;
  p_32 = anon_var_dwarf_7883 + 3;
  data_33 = anon_var_dwarf_7883;
  iVar1 = mp_check(&data_33,anon_var_dwarf_7883 + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ce,
      "ill 3");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_ILL),"last_error.type == MP_CHECK_ERROR_ILL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ce,
      "ill 3 - error type");
  _ok((uint)(last_error.data == end_32),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ce,
      "ill 3 - error data");
  _ok((uint)(last_error.end == p_32),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ce,
      "ill 3 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 2),
      "last_error.pos - last_error.data == (ptrdiff_t)2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6ce,
      "ill 3 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ce,"ill 3 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ce,"ill 3 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6ce,"ill 3 - error ext len");
  }
  end_33 = anon_var_dwarf_888b;
  p_33 = anon_var_dwarf_888b + 3;
  data_34 = anon_var_dwarf_888b;
  iVar1 = mp_check(&data_34,anon_var_dwarf_888b + 3);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d0,
      "bad fixext");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_EXT),"last_error.type == MP_CHECK_ERROR_EXT",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d0,
      "bad fixext - error type");
  _ok((uint)(last_error.data == end_33),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d0,
      "bad fixext - error data");
  _ok((uint)(last_error.end == p_33),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d0,
      "bad fixext - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 2),
      "last_error.pos - last_error.data == (ptrdiff_t)2",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d0,
      "bad fixext - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d0,"bad fixext - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == 'B'),"last_error.ext_type == 0x42",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d0,"bad fixext - error ext type");
    _ok((uint)(last_error.ext_len == 1),"last_error.ext_len == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d0,"bad fixext - error ext len");
  }
  end_34 = anon_var_dwarf_891b;
  p_34 = anon_var_dwarf_891b + 4;
  data_35 = anon_var_dwarf_891b;
  iVar1 = mp_check(&data_35,anon_var_dwarf_891b + 4);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d1,
      "bad ext8");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_EXT),"last_error.type == MP_CHECK_ERROR_EXT",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d1,
      "bad ext8 - error type");
  _ok((uint)(last_error.data == end_34),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d1,
      "bad ext8 - error data");
  _ok((uint)(last_error.end == p_34),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d1,
      "bad ext8 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 3),
      "last_error.pos - last_error.data == (ptrdiff_t)3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d1,
      "bad ext8 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d1,"bad ext8 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == 'B'),"last_error.ext_type == 0x42",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d1,"bad ext8 - error ext type");
    _ok((uint)(last_error.ext_len == 1),"last_error.ext_len == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d1,"bad ext8 - error ext len");
  }
  end_35 = anon_var_dwarf_8987;
  p_35 = anon_var_dwarf_8987 + 5;
  data_36 = anon_var_dwarf_8987;
  iVar1 = mp_check(&data_36,anon_var_dwarf_8987 + 5);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d2,
      "bad ext16");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_EXT),"last_error.type == MP_CHECK_ERROR_EXT",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d2,
      "bad ext16 - error type");
  _ok((uint)(last_error.data == end_35),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d2,
      "bad ext16 - error data");
  _ok((uint)(last_error.end == p_35),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d2,
      "bad ext16 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 4),
      "last_error.pos - last_error.data == (ptrdiff_t)4",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d2,
      "bad ext16 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d2,"bad ext16 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == 'B'),"last_error.ext_type == 0x42",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d2,"bad ext16 - error ext type");
    _ok((uint)(last_error.ext_len == 1),"last_error.ext_len == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d2,"bad ext16 - error ext len");
  }
  end_36 = anon_var_dwarf_89f3;
  p_36 = anon_var_dwarf_89f3 + 7;
  data_37 = anon_var_dwarf_89f3;
  iVar1 = mp_check(&data_37,anon_var_dwarf_89f3 + 7);
  _ok((uint)(iVar1 != 0),"mp_check(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d3,
      "bad ext32");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_EXT),"last_error.type == MP_CHECK_ERROR_EXT",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d3,
      "bad ext32 - error type");
  _ok((uint)(last_error.data == end_36),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d3,
      "bad ext32 - error data");
  _ok((uint)(last_error.end == p_36),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d3,
      "bad ext32 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 6),
      "last_error.pos - last_error.data == (ptrdiff_t)6",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d3,
      "bad ext32 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d3,"bad ext32 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == 'B'),"last_error.ext_type == 0x42",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d3,"bad ext32 - error ext type");
    _ok((uint)(last_error.ext_len == 1),"last_error.ext_len == 1",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d3,"bad ext32 - error ext len");
  }
  end_37 = anon_var_dwarf_7967 + 3;
  p_37 = anon_var_dwarf_7967 + 5;
  data_38 = anon_var_dwarf_7967 + 3;
  iVar1 = mp_check_exact(&data_38,anon_var_dwarf_7967 + 5);
  _ok((uint)(iVar1 != 0),"mp_check_exact(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d5,
      "junk 1");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_JUNK),"last_error.type == MP_CHECK_ERROR_JUNK",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d5,
      "junk 1 - error type");
  _ok((uint)(last_error.data == end_37),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d5,
      "junk 1 - error data");
  _ok((uint)(last_error.end == p_37),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d5,
      "junk 1 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 1),
      "last_error.pos - last_error.data == (ptrdiff_t)1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d5,
      "junk 1 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d5,"junk 1 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d5,"junk 1 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d5,"junk 1 - error ext len");
  }
  end_38 = anon_var_dwarf_8ad7;
  p_38 = anon_var_dwarf_8ad7 + 3;
  data_39 = anon_var_dwarf_8ad7;
  iVar1 = mp_check_exact(&data_39,anon_var_dwarf_8ad7 + 3);
  _ok((uint)(iVar1 != 0),"mp_check_exact(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d6,
      "junk 2");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_JUNK),"last_error.type == MP_CHECK_ERROR_JUNK",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d6,
      "junk 2 - error type");
  _ok((uint)(last_error.data == end_38),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d6,
      "junk 2 - error data");
  _ok((uint)(last_error.end == p_38),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d6,
      "junk 2 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 1),
      "last_error.pos - last_error.data == (ptrdiff_t)1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d6,
      "junk 2 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d6,"junk 2 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d6,"junk 2 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d6,"junk 2 - error ext len");
  }
  end_39 = anon_var_dwarf_7937;
  p_39 = anon_var_dwarf_7937 + 4;
  local_3e8 = anon_var_dwarf_7937;
  iVar1 = mp_check_exact(&local_3e8,anon_var_dwarf_7937 + 4);
  _ok((uint)(iVar1 != 0),"mp_check_exact(&p, end) != 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d7,
      "junk 3");
  _ok((uint)(last_error.type == MP_CHECK_ERROR_JUNK),"last_error.type == MP_CHECK_ERROR_JUNK",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d7,
      "junk 3 - error type");
  _ok((uint)(last_error.data == end_39),"last_error.data == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d7,
      "junk 3 - error data");
  _ok((uint)(last_error.end == p_39),"last_error.end == end",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d7,
      "junk 3 - error data end");
  _ok((uint)((long)last_error.pos - (long)last_error.data == 3),
      "last_error.pos - last_error.data == (ptrdiff_t)3",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x6d7,
      "junk 3 - error data pos");
  if (last_error.type == MP_CHECK_ERROR_TRUNC) {
    _ok((uint)(last_error.trunc_count == 0),"last_error.trunc_count == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d7,"junk 3 - error trunc count");
  }
  if (last_error.type == MP_CHECK_ERROR_EXT) {
    _ok((uint)(last_error.ext_type == '\0'),"last_error.ext_type == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d7,"junk 3 - error ext type");
    _ok((uint)(last_error.ext_len == 0),"last_error.ext_len == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x6d7,"junk 3 - error ext len");
  }
  mp_check_ext_data = (mp_check_ext_data_f)mp_check_on_error_svp;
  mp_check_on_error = (mp_check_on_error_f)data;
  _space(_stdout);
  printf("# *** %s: done ***\n","test_mp_check_error");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_mp_check_error(void)
{
	const int trunc_error_count = 30;
	const int ill_error_count = 3;
	const int ext_error_count = 4;
	const int junk_error_count = 3;
	plan(6 * trunc_error_count +
	     5 * ill_error_count +
	     7 * ext_error_count +
	     5 * junk_error_count);
	header();

	mp_check_ext_data_f mp_check_ext_data_svp = mp_check_ext_data;
	mp_check_ext_data = mp_check_ext_data_test;
	mp_check_on_error_f mp_check_on_error_svp = mp_check_on_error;
	mp_check_on_error = mp_check_on_error_test;

#define check_error(check_, data_, offset_, type_, trunc_count_,	\
		    ext_type_, ext_len_, msg_)				\
	do {			\
		const char *data = data_;				\
		const char *end = data + sizeof(data_) - 1;		\
		const char *p = data;					\
		isnt(check_(&p, end), 0, msg_);				\
		is(last_error.type, type_, msg_ " - error type");	\
		is(last_error.data, data, msg_ " - error data");	\
		is(last_error.end, end, msg_ " - error data end");	\
		is(last_error.pos - last_error.data, (ptrdiff_t)offset_,\
		   msg_ " - error data pos");				\
		if (last_error.type == MP_CHECK_ERROR_TRUNC) {		\
			is(last_error.trunc_count, trunc_count_,	\
			   msg_ " - error trunc count");		\
		}							\
		if (last_error.type == MP_CHECK_ERROR_EXT) {		\
			is(last_error.ext_type, ext_type_,		\
			   msg_ " - error ext type");			\
			is(last_error.ext_len, ext_len_,		\
			   msg_ " - error ext len");			\
		}							\
	} while (0)

#define check_error_trunc(data_, offset_, trunc_count_, msg_)		\
	check_error(mp_check, data_, offset_, MP_CHECK_ERROR_TRUNC,	\
		    trunc_count_, 0, 0, msg_)

#define check_error_ill(data_, offset_, msg_)				\
	check_error(mp_check, data_, offset_, MP_CHECK_ERROR_ILL,	\
		    0, 0, 0, msg_)

#define check_error_ext(data_, offset_, ext_type_, ext_len_, msg_)	\
	check_error(mp_check, data_, offset_, MP_CHECK_ERROR_EXT,	\
		    0, ext_type_, ext_len_, msg_)

#define check_error_junk(data_, offset_, msg_)				\
	check_error(mp_check_exact, data_, offset_, MP_CHECK_ERROR_JUNK,\
		    0, 0, 0, msg_)

	check_error_trunc("", 0, 1, "empty");

	check_error_trunc("\xa2", 0, 1, "trunc fixstr");
	check_error_trunc("\xd9", 0, 1, "trunc str8 header");
	check_error_trunc("\xd9\x10", 0, 1, "trunc str8 data");
	check_error_trunc("\xda\x00", 0, 1, "trunc str16 header");
	check_error_trunc("\xda\x00\x10", 0, 1, "trunc str16 data");
	check_error_trunc("\xdb\x00\x00\x00", 0, 1, "trunc str32 header");
	check_error_trunc("\xdb\x00\x00\x00\x10", 0, 1, "trunc str32 data");

	check_error_trunc("\x92", 1, 2, "trunc fixarray");
	check_error_trunc("\xdc\x00", 0, 1, "trunc array16 header");
	check_error_trunc("\xdc\x00\x10", 3, 16, "trunc array16 data");
	check_error_trunc("\xdd\x00\x00\x00", 0, 1, "trunc array32 header");
	check_error_trunc("\xdd\x00\x00\x00\x10", 5, 16, "trunc array32 data");

	check_error_trunc("\x82", 1, 4, "trunc fixmap");
	check_error_trunc("\xde\x00", 0, 1, "trunc map16 header");
	check_error_trunc("\xde\x00\x10", 3, 32, "trunc map16 data");
	check_error_trunc("\xdf\x00\x00\x00", 0, 1, "trunc map32 header");
	check_error_trunc("\xdf\x00\x00\x00\x10", 5, 32, "trunc map32 data");

	check_error_trunc("\xd4", 0, 1, "trunc fixext header");
	check_error_trunc("\xd4\x42", 0, 1, "trunc fixext data");
	check_error_trunc("\xc7\x10", 0, 1, "trunc ext8 header");
	check_error_trunc("\xc7\x10\x42", 0, 1, "trunc ext8 data");
	check_error_trunc("\xc8\x00\x10", 0, 1, "trunc ext16 header");
	check_error_trunc("\xc8\x00\x10\x42", 0, 1, "trunc ext16 data");
	check_error_trunc("\xc9\x00\x00\x00\x10", 0, 1, "trunc ext32 header");
	check_error_trunc("\xc9\x00\x00\x00\x10\x42", 0, 1, "trunc ext32 data");

	check_error_trunc("\x92\x82", 2, 5, "trunc nested 1");
	check_error_trunc("\x92\x82\xc0", 3, 4, "trunc nested 2");
	check_error_trunc("\x92\x82\xc0\x92", 4, 5, "trunc nested 3");
	check_error_trunc("\x92\x82\xc0\x92\x82", 5, 8, "trunc nested 4");

	check_error_ill("\xc1", 0, "ill 1");
	check_error_ill("\x92\xc1", 1, "ill 2");
	check_error_ill("\x92\xc0\xc1", 2, "ill 3");

	check_error_ext("\xd4\x42\x00", 2, 0x42, 1, "bad fixext");
	check_error_ext("\xc7\x01\x42\x00", 3, 0x42, 1, "bad ext8");
	check_error_ext("\xc8\x00\x01\x42\x00", 4, 0x42, 1, "bad ext16");
	check_error_ext("\xc9\x00\x00\x00\x01\x42\x00", 6, 0x42, 1, "bad ext32");

	check_error_junk("\xc0\xc0", 1, "junk 1");
	check_error_junk("\xc0\x91\xc1", 1, "junk 2");
	check_error_junk("\x92\xc0\xc0\xc0", 3, "junk 3");

#undef check_error_junk
#undef check_error_ext
#undef check_error_ill
#undef check_error_trunc
#undef check_error

	mp_check_ext_data = mp_check_ext_data_svp;
	mp_check_on_error = mp_check_on_error_svp;

	footer();
	return check_plan();
}